

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

Function * __thiscall
dg::llvmdg::legacy::GraphBuilder::buildFunction
          (GraphBuilder *this,Function *llvmFunction,bool recursively)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  _Base_ptr p_Var8;
  Block *pBVar9;
  Block *pBVar10;
  vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>> *pvVar11;
  mapped_type *ppBVar12;
  long lVar13;
  Block *successor;
  long extraout_RAX;
  Block *successor_00;
  _Rb_tree_node_base *p_Var14;
  _Base_ptr p_Var15;
  undefined7 in_register_00000011;
  BasicBlock *__range3;
  BasicBlock *basicBlock;
  BasicBlock *pBVar16;
  Function *pFVar17;
  int __status;
  Function *pFVar18;
  Function *pFVar19;
  Function *basicBlock_00;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>,_bool>
  pVar20;
  bool createBlock;
  bool createCallReturn;
  Block *lastBlock;
  TarjanAnalysis<dg::llvmdg::legacy::Block> tarjan;
  map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
  instToBlockMap;
  bool local_18a;
  bool local_189;
  Block *local_188;
  Function *local_180;
  Function *local_178;
  Function *local_170;
  Function *local_168;
  Function *local_160;
  GraphBuilder *local_158;
  undefined1 local_150 [192];
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  local_90;
  _Rb_tree<const_llvm::Instruction_*,_std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>,_std::_Select1st<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
  local_60;
  
  local_170 = (Function *)CONCAT44(local_170._4_4_,(int)CONCAT71(in_register_00000011,recursively));
  if (llvmFunction == (Function *)0x0) {
LAB_0012774a:
    pFVar18 = (Function *)0x0;
  }
  else {
    p_Var8 = (this->_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var8 != (_Base_ptr)0x0) {
      p_Var1 = &(this->_functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = &p_Var1->_M_header;
      do {
        if (*(Function **)(p_Var8 + 1) >= llvmFunction) {
          p_Var15 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[*(Function **)(p_Var8 + 1) < llvmFunction];
      } while (p_Var8 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var15 != p_Var1) && (*(Function **)(p_Var15 + 1) <= llvmFunction))
      goto LAB_0012774a;
    }
    local_168 = llvmFunction;
    pBVar9 = (Block *)operator_new(0x40);
    Function::Function((Function *)pBVar9);
    local_150._0_8_ = pBVar9;
    pVar20 = std::
             _Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>,std::_Select1st<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>>
             ::_M_emplace_unique<llvm::Function_const*&,dg::llvmdg::legacy::Function*>
                       ((_Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>,std::_Select1st<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,dg::llvmdg::legacy::Function*>>>
                         *)&this->_functions,&local_168,(Function **)local_150);
    pFVar18 = (Function *)pVar20.first._M_node._M_node[1]._M_parent;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_188 = (Block *)0x0;
    local_160 = local_168 + 0x48;
    pFVar19 = *(Function **)(local_168 + 0x50);
    local_180 = pFVar18;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pFVar19 != local_160) {
      local_158 = this;
      do {
        basicBlock = (BasicBlock *)(pFVar19 + -0x18);
        if (pFVar19 == (Function *)0x0) {
          basicBlock = (BasicBlock *)0x0;
        }
        iVar5 = predecessorsNumber(basicBlock);
        if (iVar5 < 1) {
          bVar4 = pFVar19 == (Function *)0x0;
          if (*(long *)(*(long *)(basicBlock + 0x38) + 0x50) != 0) {
            bVar4 = (BasicBlock *)(*(long *)(*(long *)(basicBlock + 0x38) + 0x50) + -0x18) ==
                    basicBlock;
          }
          if (bVar4) goto LAB_00127356;
        }
        else {
LAB_00127356:
          local_18a = true;
          local_178 = pFVar19;
          for (pBVar16 = *(BasicBlock **)(basicBlock + 0x30); pFVar19 = local_178,
              pBVar16 != basicBlock + 0x28; pBVar16 = *(BasicBlock **)(pBVar16 + 8)) {
            pBVar9 = (Block *)(pBVar16 + -0x18);
            if (pBVar16 == (BasicBlock *)0x0) {
              pBVar9 = (Block *)0x0;
            }
            if (local_18a == true) {
              pBVar10 = (Block *)operator_new(0x118);
              Block::Block(pBVar10,basicBlock,false);
              local_150._0_8_ = pBVar10;
              local_90._M_impl._0_8_ = basicBlock;
              pvVar11 = (vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>
                         *)std::__detail::
                           _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)&this->_mapping,(key_type *)&local_90);
              iVar2._M_current = *(Block ***)(pvVar11 + 8);
              if (iVar2._M_current == *(Block ***)(pvVar11 + 0x10)) {
                std::vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>::
                _M_realloc_insert<dg::llvmdg::legacy::Block*const&>
                          (pvVar11,iVar2,(Block **)local_150);
              }
              else {
                *iVar2._M_current = (Block *)local_150._0_8_;
                *(long *)(pvVar11 + 8) = *(long *)(pvVar11 + 8) + 8;
              }
              pFVar18 = local_180;
              Function::addBlock(local_180,(Block *)local_150._0_8_);
              if ((local_188 != (Block *)0x0) && (local_188->_llvm_blk == basicBlock)) {
                Block::addSuccessor(local_188,(Block *)local_150._0_8_);
              }
              local_188 = (Block *)local_150._0_8_;
              local_18a = false;
            }
            local_189 = false;
            if (((char)local_170 != '\0') &&
               (*(char *)&(((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                             *)&(pBVar9->llvmInstructions_).
                                super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->_M_t)._M_impl == 'S'))
            {
              handleCallInstruction(local_158,(Instruction *)pBVar9,local_188,&local_18a,&local_189)
              ;
            }
            Block::addInstruction(local_188,(Instruction *)pBVar9);
            local_150._0_8_ = pBVar9;
            std::
            _Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>>
            ::_M_emplace_unique<llvm::Instruction_const*,dg::llvmdg::legacy::Block*&>
                      ((_Rb_tree<llvm::Instruction_const*,std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>,std::_Select1st<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>,std::less<llvm::Instruction_const*>,std::allocator<std::pair<llvm::Instruction_const*const,dg::llvmdg::legacy::Block*>>>
                        *)&local_60,(Instruction **)local_150,&local_188);
            if (local_189 == true) {
              pBVar9 = (Block *)operator_new(0x118);
              Block::Block(pBVar9,basicBlock,true);
              local_150._0_8_ = pBVar9;
              local_90._M_impl._0_8_ = basicBlock;
              pvVar11 = (vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>
                         *)std::__detail::
                           _Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::operator[]((_Map_base<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                         *)&this->_mapping,(key_type *)&local_90);
              iVar2._M_current = *(Block ***)(pvVar11 + 8);
              if (iVar2._M_current == *(Block ***)(pvVar11 + 0x10)) {
                std::vector<dg::llvmdg::legacy::Block*,std::allocator<dg::llvmdg::legacy::Block*>>::
                _M_realloc_insert<dg::llvmdg::legacy::Block*const&>
                          (pvVar11,iVar2,(Block **)local_150);
              }
              else {
                *iVar2._M_current = (Block *)local_150._0_8_;
                *(long *)(pvVar11 + 8) = *(long *)(pvVar11 + 8) + 8;
              }
              Function::addBlock(pFVar18,(Block *)local_150._0_8_);
              Block::addSuccessor(local_188,(Block *)local_150._0_8_);
              local_188 = (Block *)local_150._0_8_;
              local_18a = true;
            }
          }
        }
        pFVar19 = *(Function **)(pFVar19 + 8);
      } while (pFVar19 != local_160);
      pFVar19 = *(Function **)(local_168 + 0x50);
    }
    pFVar17 = local_168 + 0x48;
    if (pFVar19 != pFVar17) {
      local_170 = pFVar17;
      do {
        basicBlock_00 = pFVar19 + -0x18;
        if (pFVar19 == (Function *)0x0) {
          basicBlock_00 = (Function *)0x0;
        }
        iVar5 = predecessorsNumber((BasicBlock *)basicBlock_00);
        if (iVar5 < 1) {
          bVar4 = pFVar19 == (Function *)0x0;
          if (*(long *)(*(long *)((BasicBlock *)basicBlock_00 + 0x38) + 0x50) != 0) {
            bVar4 = (BasicBlock *)
                    (*(long *)(*(long *)((BasicBlock *)basicBlock_00 + 0x38) + 0x50) + -0x18) ==
                    (BasicBlock *)basicBlock_00;
          }
          if (bVar4) goto LAB_00127599;
        }
        else {
LAB_00127599:
          local_150._0_8_ = *(long *)((BasicBlock *)basicBlock_00 + 0x28) + -0x18;
          if (*(long *)((BasicBlock *)basicBlock_00 + 0x28) == 0) {
            local_150._0_8_ = (Block *)0x0;
          }
          pBVar10 = (Block *)local_150;
          local_178 = pFVar19;
          ppBVar12 = std::
                     map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                     ::operator[]((map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                                   *)&local_60,(key_type *)local_150);
          pBVar9 = *ppBVar12;
          uVar6 = llvm::BasicBlock::getTerminator();
          iVar5 = 0;
          while( true ) {
            __status = (int)pBVar10;
            lVar13 = llvm::BasicBlock::getTerminator();
            iVar7 = 0;
            if (lVar13 != 0) {
              iVar7 = llvm::Instruction::getNumSuccessors();
            }
            if (iVar5 == iVar7) break;
            lVar13 = llvm::Instruction::getSuccessor(uVar6);
            local_150._0_8_ = *(long *)(lVar13 + 0x30) + -0x18;
            if (*(long *)(lVar13 + 0x30) == 0) {
              local_150._0_8_ = (Block *)0x0;
            }
            ppBVar12 = std::
                       map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                       ::operator[]((map<const_llvm::Instruction_*,_dg::llvmdg::legacy::Block_*,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
                                     *)&local_60,(key_type *)local_150);
            pBVar10 = *ppBVar12;
            Block::addSuccessor(pBVar9,pBVar10);
            iVar5 = iVar5 + 1;
          }
          lVar13 = llvm::BasicBlock::getTerminator();
          pFVar17 = local_170;
          pFVar19 = local_178;
          if ((lVar13 == 0) || (iVar5 = llvm::Instruction::getNumSuccessors(), iVar5 == 0)) {
            Function::exit(local_180,__status);
            Block::addSuccessor(pBVar9,successor);
          }
        }
        pFVar19 = *(Function **)(pFVar19 + 8);
      } while (pFVar19 != pFVar17);
    }
    pFVar18 = local_180;
    Function::nodes((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
                     *)&local_90,local_180);
    TarjanAnalysis<dg::llvmdg::legacy::Block>::TarjanAnalysis
              ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)local_150,
               local_90._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
    ::_M_erase(&local_90,(_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
    pBVar9 = Function::entry(pFVar18);
    TarjanAnalysis<dg::llvmdg::legacy::Block>::compute
              ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)local_150,pBVar9);
    TarjanAnalysis<dg::llvmdg::legacy::Block>::computeCondensation
              ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)local_150);
    for (p_Var14 = (_Rb_tree_node_base *)local_150._168_8_;
        p_Var14 != (_Rb_tree_node_base *)(local_150 + 0x98);
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      lVar13 = *(long *)(p_Var14 + 1);
      if (((*(long *)(lVar13 + 0x10) - *(long *)(lVar13 + 8) != 8) ||
          (lVar3 = *(long *)(*(long *)(lVar13 + 0x10) + -8), Function::exit(local_180,(int)pBVar9),
          pFVar18 = local_180, lVar3 != extraout_RAX)) && (*(long *)(lVar13 + 0x48) == 0)) {
        pBVar10 = *(Block **)(*(long *)(lVar13 + 0x10) + -8);
        Function::exit(pFVar18,(int)pBVar9);
        pBVar9 = successor_00;
        Block::addSuccessor(pBVar10,successor_00);
      }
    }
    TarjanAnalysis<dg::llvmdg::legacy::Block>::~TarjanAnalysis
              ((TarjanAnalysis<dg::llvmdg::legacy::Block> *)local_150);
    std::
    _Rb_tree<const_llvm::Instruction_*,_std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>,_std::_Select1st<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>,_std::less<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_dg::llvmdg::legacy::Block_*>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  return pFVar18;
}

Assistant:

Function *GraphBuilder::buildFunction(const llvm::Function *llvmFunction,
                                      bool recursively) {
    if (!llvmFunction) {
        return nullptr;
    }
    auto iterator = _functions.find(llvmFunction);
    if (iterator != _functions.end()) {
        return nullptr;
    }
    iterator = _functions.emplace(llvmFunction, new Function()).first;
    Function *function = iterator->second;

    std::map<const llvm::Instruction *, Block *> instToBlockMap;
    Block *lastBlock = nullptr;
    for (const auto &llvmBlock : *llvmFunction) {
        if (!isReachable(&llvmBlock)) {
            continue;
        }

        bool createBlock = true;
        for (const auto &llvmInst : llvmBlock) {
            if (createBlock) {
                auto *tmpBlock = new Block(&llvmBlock);
                _mapping[&llvmBlock].push_back(tmpBlock);
                function->addBlock(tmpBlock);
                if (lastBlock) {
                    if (lastBlock->llvmBlock() == &llvmBlock) {
                        lastBlock->addSuccessor(tmpBlock);
                    }
                }
                lastBlock = tmpBlock;
                createBlock = false;
            }
            bool createCallReturn = false;
            if (recursively &&
                llvmInst.getOpcode() == llvm::Instruction::Call) {
                handleCallInstruction(&llvmInst, lastBlock, createBlock,
                                      createCallReturn);
            }
            lastBlock->addInstruction(&llvmInst);
            instToBlockMap.emplace(&llvmInst, lastBlock);

            if (createCallReturn) {
                auto *tmpBlock = new Block(&llvmBlock, createCallReturn);
                _mapping[&llvmBlock].push_back(tmpBlock);
                function->addBlock(tmpBlock);
                lastBlock->addSuccessor(tmpBlock);
                lastBlock = tmpBlock;
                createBlock = true;
            }
        }
    }

    for (const auto &llvmBlock : *llvmFunction) {
        if (isReachable(&llvmBlock)) {
            auto *block = instToBlockMap[&llvmBlock.back()];
            for (auto succ = llvm::succ_begin(&llvmBlock);
                 succ != llvm::succ_end(&llvmBlock); ++succ) {
                auto *succ_block = instToBlockMap[&succ->front()];
                block->addSuccessor(succ_block);
            }
            if (successorsNumber(&llvmBlock) == 0) {
                block->addSuccessor(function->exit());
            }
        }
    }

    TarjanAnalysis<Block> tarjan(function->nodes().size());
    tarjan.compute(function->entry());
    tarjan.computeCondensation();
    const auto &componentss = tarjan.components();
    for (auto *const component : componentss) {
        if (!isExit(component, function) && component->successors().empty()) {
            component->nodes().back()->addSuccessor(function->exit());
        }
    }

    //    auto components =
    //    tarjan.computeBackWardReachability(function->exit());

    //    for (auto component : components) {
    //        if (component->nodes().size() > 1 ||
    //            component->successors().find(component) !=
    //            component->successors().end()) {
    //            component->nodes().back()->addSuccessor(function->exit());
    //        }
    //    }

    return function;
}